

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O3

bool __thiscall
axl::sl::Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::
setCountImpl<axl::sl::SimpleArrayDetails<unsigned_long>::ZeroConstruct>
          (Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *this,size_t count)

{
  int32_t *piVar1;
  size_t sVar2;
  ulong uVar3;
  unsigned_long *src;
  Hdr *pHVar4;
  FreeFunc *pFVar5;
  BufHdr *pBVar6;
  size_t sVar7;
  EVP_PKEY_CTX *dst;
  Hdr *pHVar8;
  bool bVar9;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_38;
  
  sVar2 = count * 8;
  pHVar8 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_hdr;
  if ((pHVar8 != (Hdr *)0x0) && ((pHVar8->super_RefCount).m_refCount == 1)) {
    uVar3 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count;
    if (count == uVar3) {
      return true;
    }
    if (sVar2 <= pHVar8->m_bufferSize) {
      if (uVar3 <= count && count - uVar3 != 0) {
        memset((this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_p +
               uVar3,0,(count - uVar3) * 8);
      }
      (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count = count;
      return true;
    }
  }
  if (count == 0) {
    ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::release
              (&this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>);
  }
  else {
    if ((this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count != 0) {
      sVar7 = getAllocSize<4096ul>(sVar2);
      dst = (EVP_PKEY_CTX *)operator_new(sVar7 + 0x28,(nothrow_t *)&std::nothrow);
      *(undefined4 *)(dst + 0x10) = 0;
      *(undefined4 *)(dst + 0x14) = 1;
      *(undefined ***)dst = &PTR__RefCount_0014c0d8;
      *(size_t *)(dst + 0x18) = sVar7;
      *(undefined8 *)(dst + 0x20) = 0;
      *(code **)(dst + 8) = mem::deallocate;
      local_38.m_p = (Hdr *)0x0;
      local_38.m_refCount = (RefCount *)0x0;
      rc::Ptr<axl::rc::BufHdr>::copy(&local_38,dst,dst);
      bVar9 = local_38.m_p != (Hdr *)0x0;
      if (bVar9) {
        pHVar8 = local_38.m_p + 1;
        src = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_p;
        uVar3 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count
        ;
        if (uVar3 < count) {
          __wrap_memcpy(pHVar8,src,uVar3 << 3);
          sVar2 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).
                  m_count;
          memset(&(pHVar8->super_RefCount)._vptr_RefCount + sVar2,0,(count - sVar2) * 8);
        }
        else {
          __wrap_memcpy(pHVar8,src,sVar2);
        }
        pHVar4 = (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_hdr;
        LOCK();
        piVar1 = &(pHVar4->super_RefCount).m_refCount;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          (**(pHVar4->super_RefCount)._vptr_RefCount)(pHVar4);
          LOCK();
          piVar1 = &(pHVar4->super_RefCount).m_weakRefCount;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) &&
             (pFVar5 = (pHVar4->super_RefCount).m_freeFunc, pFVar5 != (FreeFunc *)0x0)) {
            (*pFVar5)(pHVar4);
          }
        }
        pBVar6 = local_38.m_p;
        (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_p =
             (unsigned_long *)pHVar8;
        local_38.m_p = (Hdr *)0x0;
        local_38.m_refCount = (RefCount *)0x0;
        (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_hdr = pBVar6;
        (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count = count
        ;
      }
      rc::Ptr<axl::rc::BufHdr>::clear(&local_38);
      return bVar9;
    }
    bVar9 = reserve(this,count);
    if (!bVar9) {
      return false;
    }
    memset((this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_p,0,sVar2)
    ;
    (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count = count;
  }
  return true;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}